

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

int event_reinit(event_base *base)

{
  evsig_info *ev;
  eventop *peVar1;
  _func_int_event_base_ptr *p_Var2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,base->th_base_lock);
  }
  if (base->running_loop == 0) {
    peVar1 = base->evsel;
    if (peVar1->need_reinit != 0) {
      base->evsel = &nil_eventop;
    }
    ev = &base->sig;
    iVar4 = (base->sig).ev_signal_added;
    if (iVar4 != 0) {
      event_del_nolock_(&ev->ev_signal,2);
      event_debug_unassign(&ev->ev_signal);
      (base->sig).ev_signal.ev_timeout.tv_sec = 0;
      (base->sig).ev_signal.ev_timeout.tv_usec = 0;
      (base->sig).ev_signal.ev_.ev_io.ev_timeout.tv_usec = 0;
      (base->sig).ev_signal.ev_events = 0;
      (base->sig).ev_signal.ev_res = 0;
      *(undefined4 *)&(base->sig).ev_signal.field_0x6c = 0;
      (base->sig).ev_signal.ev_.ev_io.ev_io_next.le_prev = (event **)0x0;
      (base->sig).ev_signal.ev_.ev_io.ev_timeout.tv_sec = 0;
      (base->sig).ev_signal.ev_base = (event_base *)0x0;
      (base->sig).ev_signal.ev_.ev_io.ev_io_next.le_next = (event *)0x0;
      (base->sig).ev_signal.ev_timeout_pos.ev_next_with_common_timeout.tqe_prev = (event **)0x0;
      *(undefined8 *)&(base->sig).ev_signal.ev_fd = 0;
      (base->sig).ev_signal.ev_evcallback.evcb_arg = (void *)0x0;
      (base->sig).ev_signal.ev_timeout_pos.ev_next_with_common_timeout.tqe_next = (event *)0x0;
      (base->sig).ev_signal.ev_evcallback.evcb_flags = 0;
      (base->sig).ev_signal.ev_evcallback.evcb_pri = '\0';
      (base->sig).ev_signal.ev_evcallback.evcb_closure = '\0';
      *(undefined4 *)&(base->sig).ev_signal.ev_evcallback.field_0x14 = 0;
      (base->sig).ev_signal.ev_evcallback.evcb_cb_union.evcb_callback =
           (_func_void_int_short_void_ptr *)0x0;
      (ev->ev_signal).ev_evcallback.evcb_active_next.tqe_next = (event_callback *)0x0;
      (base->sig).ev_signal.ev_evcallback.evcb_active_next.tqe_prev = (event_callback **)0x0;
      (base->sig).ev_signal_added = 0;
    }
    iVar3 = (base->sig).ev_signal_pair[0];
    if (iVar3 != -1) {
      evutil_closesocket(iVar3);
    }
    iVar3 = (base->sig).ev_signal_pair[1];
    if (iVar3 != -1) {
      evutil_closesocket(iVar3);
    }
    p_Var2 = base->th_notify_fn;
    if (p_Var2 != (_func_int_event_base_ptr *)0x0) {
      base->th_notify_fn = (_func_int_event_base_ptr *)0x0;
    }
    if (base->th_notify_fd[0] != -1) {
      event_del_nolock_(&base->th_notify,2);
      evutil_closesocket(base->th_notify_fd[0]);
      if (base->th_notify_fd[1] != -1) {
        evutil_closesocket(base->th_notify_fd[1]);
      }
      base->th_notify_fd[0] = -1;
      base->th_notify_fd[1] = -1;
      event_debug_unassign(&base->th_notify);
    }
    base->evsel = peVar1;
    if (peVar1->need_reinit == 0) {
      iVar3 = evsig_init_(base);
      if (iVar3 == 0 && iVar4 != 0) {
        iVar3 = 0;
        iVar4 = event_add_nolock_(&ev->ev_signal,(timeval *)0x0,0);
        if (iVar4 != 0) goto LAB_001f4da8;
        (base->sig).ev_signal_added = 1;
      }
    }
    else {
      if (peVar1->dealloc != (_func_void_event_base_ptr *)0x0) {
        (*peVar1->dealloc)(base);
      }
      pvVar5 = (*peVar1->init)(base);
      base->evbase = pvVar5;
      if (pvVar5 == (void *)0x0) {
        event_errx(1,"%s: could not reinitialize event mechanism","event_reinit");
      }
      event_changelist_freemem_(&base->changelist);
      iVar3 = evmap_reinit_(base);
      iVar3 = iVar3 >> 0x1f;
    }
    iVar4 = iVar3;
    if (iVar3 == 0 && p_Var2 != (_func_int_event_base_ptr *)0x0) {
      iVar4 = evthread_make_base_notifiable_nolock_(base);
    }
  }
  else {
    event_warnx("%s: forked from the event_loop.","event_reinit");
    iVar4 = -1;
  }
LAB_001f4da8:
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
  }
  return iVar4;
}

Assistant:

int
event_reinit(struct event_base *base)
{
	const struct eventop *evsel;
	int res = 0;
	int was_notifiable = 0;
	int had_signal_added = 0;

	EVBASE_ACQUIRE_LOCK(base, th_base_lock);

	if (base->running_loop) {
		event_warnx("%s: forked from the event_loop.", __func__);
		res = -1;
		goto done;
	}

	evsel = base->evsel;

	/* check if this event mechanism requires reinit on the backend */
	if (evsel->need_reinit) {
		/* We're going to call event_del() on our notify events (the
		 * ones that tell about signals and wakeup events).  But we
		 * don't actually want to tell the backend to change its
		 * state, since it might still share some resource (a kqueue,
		 * an epoll fd) with the parent process, and we don't want to
		 * delete the fds from _that_ backend, we temporarily stub out
		 * the evsel with a replacement.
		 */
		base->evsel = &nil_eventop;
	}

	/* We need to re-create a new signal-notification fd and a new
	 * thread-notification fd.  Otherwise, we'll still share those with
	 * the parent process, which would make any notification sent to them
	 * get received by one or both of the event loops, more or less at
	 * random.
	 */
	if (base->sig.ev_signal_added) {
		event_del_nolock_(&base->sig.ev_signal, EVENT_DEL_AUTOBLOCK);
		event_debug_unassign(&base->sig.ev_signal);
		memset(&base->sig.ev_signal, 0, sizeof(base->sig.ev_signal));
		had_signal_added = 1;
		base->sig.ev_signal_added = 0;
	}
	if (base->sig.ev_signal_pair[0] != -1)
		EVUTIL_CLOSESOCKET(base->sig.ev_signal_pair[0]);
	if (base->sig.ev_signal_pair[1] != -1)
		EVUTIL_CLOSESOCKET(base->sig.ev_signal_pair[1]);
	if (base->th_notify_fn != NULL) {
		was_notifiable = 1;
		base->th_notify_fn = NULL;
	}
	if (base->th_notify_fd[0] != -1) {
		event_del_nolock_(&base->th_notify, EVENT_DEL_AUTOBLOCK);
		EVUTIL_CLOSESOCKET(base->th_notify_fd[0]);
		if (base->th_notify_fd[1] != -1)
			EVUTIL_CLOSESOCKET(base->th_notify_fd[1]);
		base->th_notify_fd[0] = -1;
		base->th_notify_fd[1] = -1;
		event_debug_unassign(&base->th_notify);
	}

	/* Replace the original evsel. */
        base->evsel = evsel;

	if (evsel->need_reinit) {
		/* Reconstruct the backend through brute-force, so that we do
		 * not share any structures with the parent process. For some
		 * backends, this is necessary: epoll and kqueue, for
		 * instance, have events associated with a kernel
		 * structure. If didn't reinitialize, we'd share that
		 * structure with the parent process, and any changes made by
		 * the parent would affect our backend's behavior (and vice
		 * versa).
		 */
		if (base->evsel->dealloc != NULL)
			base->evsel->dealloc(base);
		base->evbase = evsel->init(base);
		if (base->evbase == NULL) {
			event_errx(1,
			   "%s: could not reinitialize event mechanism",
			   __func__);
			res = -1;
			goto done;
		}

		/* Empty out the changelist (if any): we are starting from a
		 * blank slate. */
		event_changelist_freemem_(&base->changelist);

		/* Tell the event maps to re-inform the backend about all
		 * pending events. This will make the signal notification
		 * event get re-created if necessary. */
		if (evmap_reinit_(base) < 0)
			res = -1;
	} else {
		res = evsig_init_(base);
		if (res == 0 && had_signal_added) {
			res = event_add_nolock_(&base->sig.ev_signal, NULL, 0);
			if (res == 0)
				base->sig.ev_signal_added = 1;
		}
	}

	/* If we were notifiable before, and nothing just exploded, become
	 * notifiable again. */
	if (was_notifiable && res == 0)
		res = evthread_make_base_notifiable_nolock_(base);

done:
	EVBASE_RELEASE_LOCK(base, th_base_lock);
	return (res);
}